

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Ootake_PSG.c
# Opt level: O1

void OPSG_Mix(void *chip,UINT32 nSample,DEV_SMPL **pDst)

{
  int *piVar1;
  double dVar2;
  uint uVar3;
  DEV_SMPL *pDVar4;
  DEV_SMPL *pDVar5;
  int iVar6;
  int iVar7;
  long lVar8;
  ulong uVar9;
  int iVar10;
  int iVar11;
  long lVar12;
  double dVar13;
  
  if (nSample != 0) {
    pDVar4 = *pDst;
    pDVar5 = pDst[1];
    dVar2 = *(double *)((long)chip + 0x648);
    uVar9 = 0;
    do {
      lVar8 = -0x114;
      lVar12 = 0;
      iVar7 = 0;
      iVar11 = 0;
      do {
        if ((*(char *)((long)chip + lVar8 * 4 + 0x474) != '\0') &&
           (((lVar12 != 1 || (*(int *)((long)chip + 0x634) == 0)) &&
            (*(char *)((long)chip + lVar12 + 0x650) == '\0')))) {
          if (*(char *)((long)chip + lVar8 * 4 + 0x475) == '\0') {
            if (*(char *)((long)chip + lVar8 * 4 + 0x51c) == '\0') {
              if (*(int *)((long)chip + lVar8 * 4 + 0x518) != 0) {
                iVar6 = *(int *)((long)chip +
                                (ulong)(*(uint *)((long)chip + lVar8 * 4 + 0x514) >> 0x1b) * 4 +
                                lVar8 * 4 + 0x48c);
                if ((lVar12 == 0) && (*(int *)((long)chip + 0x634) != 0)) {
                  dVar13 = *(double *)((long)chip + 0x18) * 134217728.0;
                  *(int *)((long)chip + 0xc4) =
                       *(int *)((long)chip + 0xc4) +
                       (int)(long)(dVar13 / (double)(uint)((*(int *)((long)chip +
                                                                    (ulong)(*(uint *)((long)chip +
                                                                                     0x17c) >> 0x1b)
                                                                    * 4 + 0xf4) <<
                                                           ((char)*(int *)((long)chip + 0x634) *
                                                            '\x02' - 2U & 0x1f)) +
                                                          *(int *)((long)chip + 0x20)) + 0.5);
                  *(uint *)((long)chip + 0x17c) =
                       (int)(long)(dVar13 / (double)(uint)(*(int *)((long)chip + 0x62c) *
                                                          *(int *)((long)chip + 0xd8)) + 0.5) +
                       *(uint *)((long)chip + 0x17c);
                }
                else {
                  piVar1 = (int *)((long)chip + lVar8 * 4 + 0x514);
                  *piVar1 = *piVar1 + *(int *)((long)chip + lVar8 * 4 + 0x518);
                }
                iVar10 = iVar6 >> 2;
                if (0x7f < *(uint *)((long)chip + lVar8 * 4 + 0x470)) {
                  iVar10 = 0;
                }
                iVar6 = iVar6 - iVar10;
                iVar11 = iVar11 + *(int *)((long)chip + lVar8 * 4 + 0x484) * iVar6;
                iVar7 = iVar7 + iVar6 * *(int *)((long)chip + lVar8 * 4 + 0x488);
              }
            }
            else {
              uVar3 = *(uint *)((long)chip + lVar8 * 4 + 0x514);
              iVar6 = _NoiseTable[uVar3 >> 0x11];
              *(uint *)((long)chip + lVar8 * 4 + 0x514) =
                   uVar3 + *(int *)((long)chip + lVar8 * 4 + 0x524);
              iVar10 = *(int *)((long)chip + lVar8 * 4 + 0x484) * iVar6;
              if (*(int *)((long)chip + lVar8 * 4 + 0x520) == 0) {
                iVar11 = (iVar10 >> 0xc) + iVar11 + (iVar10 >> 0xe) + (iVar10 >> 1);
                iVar6 = iVar6 * *(int *)((long)chip + lVar8 * 4 + 0x488);
                iVar7 = (iVar6 >> 0xc) + iVar7 + (iVar6 >> 0xe) + (iVar6 >> 1);
              }
              else {
                iVar6 = iVar6 * *(int *)((long)chip + lVar8 * 4 + 0x488);
                iVar11 = iVar11 + iVar10 + (iVar10 >> 0xb) + (iVar10 >> 0xf) + (iVar10 >> 0xe);
                iVar7 = iVar6 + iVar7 + (iVar6 >> 0xb) + (iVar6 >> 0xf) + (iVar6 >> 0xe);
              }
            }
          }
          else {
            iVar6 = *(int *)((long)chip + lVar8 * 4 + 0x510);
            iVar10 = *(int *)((long)chip + lVar8 * 4 + 0x484) * iVar6;
            iVar11 = iVar10 + iVar11 + (iVar10 >> 3) + (iVar10 >> 5) + (iVar10 >> 4) +
                     (iVar10 >> 0xe) + (iVar10 >> 0xc) + (iVar10 >> 7) + (iVar10 >> 0xf);
            iVar6 = iVar6 * *(int *)((long)chip + lVar8 * 4 + 0x488);
            iVar7 = iVar6 + iVar7 + (iVar6 >> 3) + (iVar6 >> 5) + (iVar6 >> 4) +
                    (iVar6 >> 0xe) + (iVar6 >> 0xc) + (iVar6 >> 7) + (iVar6 >> 0xf);
          }
        }
        iVar6 = *(int *)((long)chip + lVar12 * 4 + 0x5e0);
        iVar10 = -1;
        if (iVar6 < 1) {
          if (iVar6 < 0) {
            iVar10 = 1;
            goto LAB_00166f62;
          }
        }
        else {
LAB_00166f62:
          *(int *)((long)chip + lVar12 * 4 + 0x5e0) = iVar6 + iVar10;
        }
        iVar6 = *(int *)((long)chip + lVar12 * 4 + 0x600);
        iVar10 = -1;
        if (iVar6 < 1) {
          if (iVar6 < 0) {
            iVar10 = 1;
            goto LAB_00166f83;
          }
        }
        else {
LAB_00166f83:
          *(int *)((long)chip + lVar12 * 4 + 0x600) = iVar6 + iVar10;
        }
        iVar11 = iVar11 + *(int *)((long)chip + lVar12 * 4 + 0x5e0);
        iVar7 = iVar7 + *(int *)((long)chip + lVar12 * 4 + 0x600);
        lVar12 = lVar12 + 1;
        lVar8 = lVar8 + 0x2e;
      } while (lVar12 != 6);
      pDVar4[uVar9] = (int)((double)iVar11 * dVar2);
      pDVar5[uVar9] = (int)((double)iVar7 * dVar2);
      uVar9 = uVar9 + 1;
    } while (uVar9 != nSample);
  }
  return;
}

Assistant:

static void
OPSG_Mix(
	void*		chip,
	UINT32		nSample,	// 書き出すサンプル数
	DEV_SMPL**	pDst)		// 出力先バッファ //Kitao更新。PSG専用バッファにしたためSint16に。
{
	huc6280_state* info = (huc6280_state*)chip;
	PSG*		PSGChn;
	Sint32		i;
	Uint32		j;
	Sint32		sample; //Kitao追加
	Sint32		sampleAllL; //Kitao追加。6chぶんのサンプルを足していくためのバッファ。精度を維持するために必要。6chぶん合計が終わった後に、これをSint16に変換して書き込むようにした。
	Sint32		sampleAllR; //Kitao追加。上のＲチャンネル用
	Sint32		smp; //Kitao追加。DDA音量,ノイズ音量計算用
	DEV_SMPL*	bufL = pDst[0];
	DEV_SMPL*	bufR = pDst[1];

	for (j=0; j<nSample; j++)
	{
		sampleAllL = 0;
		sampleAllR = 0;
		for (i=0; i<N_CHANNEL; i++)
		{
			PSGChn = &info->Psg[i];
			
			if ((PSGChn->bOn)&&((i != 1)||(info->LfoCtrl == 0))&&(!info->bPsgMute[i])) //Kitao更新
			{
				if (PSGChn->bDDA)
				{
					smp = PSGChn->ddaSample * PSGChn->outVolumeL;
					//smp = PSGChn->ddaSample * PSGChn->outVolumeL * (Sint32)OVERSAMPLE_RATE; //オーバーサンプリング用
					sampleAllL += smp + (smp >> 3) + (smp >> 4) + (smp >> 5) + (smp >> 7) + (smp >> 12) + (smp >> 14) + (smp >> 15); //Kitao更新。サンプリング音の音量を実機並みに調整。v2.39,v2.40,v2.62,v2.65再調整した。
					smp = PSGChn->ddaSample * PSGChn->outVolumeR;
					//smp = PSGChn->ddaSample * PSGChn->outVolumeR * (Sint32)OVERSAMPLE_RATE; //オーバーサンプリング用
					sampleAllR += smp + (smp >> 3) + (smp >> 4) + (smp >> 5) + (smp >> 7) + (smp >> 12) + (smp >> 14) + (smp >> 15); //Kitao更新。サンプリング音の音量を実機並みに調整。v2.39,v2.40,v2.62,v2.65再調整した。
				}
				else if (PSGChn->bNoiseOn)
				{
					sample = _NoiseTable[PSGChn->phase >> 17];
					PSGChn->phase += PSGChn->deltaNoisePhase; //Kitao更新
					/*
					for (k = 2; k<=OVERSAMPLE_RATE; k++) //オーバーサンプリング用
					{
						sample += _NoiseTable[PSGChn->phase>>17];
						PSGChn->phase += PSGChn->deltaNoisePhase;
					}
					*/
					
					if (PSGChn->noiseFrq == 0) //Kitao追加。noiseFrq=0(dataに0x1Fが書き込まれた)のときは音量が通常の半分とした。（ファイヤープロレスリング３、パックランド、桃太郎活劇、がんばれゴルフボーイズなど）
					{
						smp = sample * PSGChn->outVolumeL;
						sampleAllL += (smp >> 1) + (smp >> 12) + (smp >> 14); //(1/2 + 1/4096 + (1/32768 + 1/32768))
						smp = sample * PSGChn->outVolumeR;
						sampleAllR += (smp >> 1) + (smp >> 12) + (smp >> 14);
					}
					else //通常
					{
						smp = sample * PSGChn->outVolumeL;
						sampleAllL += smp + (smp >> 11) + (smp >> 14) + (smp >> 15); //Kitao更新。ノイズの音量を実機並みに調整(1 + 1/2048 + 1/16384 + 1/32768)。この"+1/32768"で絶妙(主観。大魔界村,ソルジャーブレイドなど)になる。v2.62更新
						smp = sample * PSGChn->outVolumeR;
						sampleAllR += smp + (smp >> 11) + (smp >> 14) + (smp >> 15); //Kitao更新。ノイズの音量を実機並みに調整
					}
				}
				else if (PSGChn->deltaPhase)
				{
					//Kitao更新。オーバーサンプリングしないようにした。
					sample = PSGChn->wave[PSGChn->phase >> 27];
					inc_phase(info, i); //v2.73更新
					/*
					for (k = 2; k<=OVERSAMPLE_RATE; k++) //オーバーサンプリング用
					{
						sample += PSGChn->wave[PSGChn->phase >> 27];
						inc_phase(i); //v2.73更新
					}
					*/
					if (PSGChn->frq < 128)
						sample -= sample >> 2; //低周波域の音量を制限。ブラッドギアのスタート時などで実機と同様の音に。ソルジャーブレイドなども実機に近くなった。v2.03

					sampleAllL += sample * PSGChn->outVolumeL; //Kitao更新
					sampleAllR += sample * PSGChn->outVolumeR; //Kitao更新
				}
			}
			//Kitao追加。DDA消音時はノイズ軽減のためフェードアウトで消音する。
			//			 ベラボーマン(「わしがばくだはかせじゃ」から数秒後)やパワーテニス(タイトル曲終了から数秒後。点数コール)，将棋初心者無用(音声)等で効果あり。
			if (info->DdaFadeOutL[i] > 0)
				--info->DdaFadeOutL[i];
			else if (info->DdaFadeOutL[i] < 0)
				++info->DdaFadeOutL[i];
			if (info->DdaFadeOutR[i] > 0)
				--info->DdaFadeOutR[i];
			else if (info->DdaFadeOutR[i] < 0)
				++info->DdaFadeOutR[i];
			sampleAllL += info->DdaFadeOutL[i];
			//sampleAllL += info->DdaFadeOutL[i] * OVERSAMPLE_RATE; //オーバーサンプリング用
			sampleAllR += info->DdaFadeOutR[i];
			//sampleAllR += info->DdaFadeOutR[i] * OVERSAMPLE_RATE; //オーバーサンプリング用
		}
		//Kitao更新。6ch合わさったところで、ボリューム調整してバッファに書き込む。
		bufL[j] = (DEV_SMPL)((double)sampleAllL * info->VOL);
		bufR[j] = (DEV_SMPL)((double)sampleAllR * info->VOL);
		
#ifdef ENABLE_QUEUE
		//キューを参照しPSGレジスタを更新する。Kitao更新。高速化のためサブルーチンにせずここで処理。キューの参照はシンプルにした(テンポの安定性向上)。
		while (_QueueReadIndex != _QueueWriteIndex) //v1.10更新。キュー処理をここへ統合し高速化。
		{
			write_reg(_Queue[_QueueReadIndex].reg, _Queue[_QueueReadIndex].data);
			_QueueReadIndex++; //Kitao更新
			_QueueReadIndex &= APUQUEUE_SIZE-1; //Kitao更新
		}
#endif
	}
}